

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O0

int __thiscall Socket::connect(Socket *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  uint uVar1;
  int *piVar2;
  undefined1 local_30 [8];
  sockaddr_in sin;
  uint16 port_local;
  uint32 ip_local;
  Socket *this_local;
  
  sin.sin_zero._2_2_ = SUB82(__addr,0);
  sin.sin_zero._4_4_ = __fd;
  memset(local_30,0,0x10);
  local_30._0_2_ = 2;
  local_30._2_2_ = htons(sin.sin_zero._2_2_);
  local_30._4_4_ = htonl(sin.sin_zero._4_4_);
  uVar1 = ::connect(this->s,(sockaddr *)local_30,0x10);
  piVar2 = (int *)(ulong)uVar1;
  if ((((int)uVar1 < 0) && (piVar2 = __errno_location(), *piVar2 != 0)) &&
     (piVar2 = __errno_location(), *piVar2 != 0x73)) {
    this_local._7_1_ = 0;
  }
  else {
    this_local._7_1_ = 1;
  }
  return (int)CONCAT71((int7)((ulong)piVar2 >> 8),this_local._7_1_);
}

Assistant:

bool Socket::connect(uint32 ip, uint16 port)
{
  struct sockaddr_in sin;

  memset(&sin,0,sizeof(sin));
  sin.sin_family = AF_INET;
  sin.sin_port = htons(port);
  sin.sin_addr.s_addr = htonl(ip);

  if(::connect(s, (struct sockaddr*)&sin, sizeof(sin)) < 0)
  {
    if(ERRNO && ERRNO != EINPROGRESS
#ifdef _WIN32
      && ERRNO != EWOULDBLOCK
#endif
      )
      return false;
  }

  return true;
}